

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O3

void device_reset_k053260(void *chip)

{
  *(undefined4 *)((long)chip + 8) = 0;
  *(undefined2 *)((long)chip + 0xc) = 0;
  *(undefined8 *)((long)chip + 0x18) = 0;
  *(undefined8 *)((long)chip + 0x20) = 0;
  *(undefined8 *)((long)chip + 0x28) = 0;
  *(undefined8 *)((long)chip + 0x40) = 0;
  *(undefined8 *)((long)chip + 0x48) = 0;
  *(undefined8 *)((long)chip + 0x50) = 0;
  *(undefined8 *)((long)chip + 0x68) = 0;
  *(undefined8 *)((long)chip + 0x70) = 0;
  *(undefined8 *)((long)chip + 0x78) = 0;
  *(undefined8 *)((long)chip + 0x90) = 0;
  *(undefined8 *)((long)chip + 0x98) = 0;
  *(undefined8 *)((long)chip + 0xa0) = 0;
  *(undefined8 *)((long)chip + 200) = 0;
  return;
}

Assistant:

static void device_reset_k053260(void* chip)
{
	k053260_state *info = (k053260_state *)chip;
	int i;

	memset(info->portdata, 0, sizeof(info->portdata));

	info->keyon = 0;
	info->mode = 0;

	for (i = 0; i < 4; i++)
		KDSC_voice_reset(&info->voice[i]);

	RC_RESET(&info->cycleCntr);

	return;
}